

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>
          (EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,FloatDuration<std::chrono::_V2::steady_clock> resolution)

{
  anon_class_16_2_7d74a361 __gen;
  duration<double,_std::ratio<1L,_1000000000L>_> *pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  iterator iVar2;
  iterator iVar3;
  ClockDuration<std::chrono::_V2::steady_clock> how_long;
  anon_class_1_0_00000001_for_time_clock *in_R8;
  type_conflict __x;
  double dVar4;
  undefined8 in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *this;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  *in_stack_fffffffffffffec0;
  OutlierClassification *__return_storage_ptr___00;
  double local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  int local_84;
  undefined1 local_80 [4];
  int nsamples;
  vector<double,_std::allocator<double>_> times;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  local_60;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  *local_48;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  *r;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_38;
  int iters;
  anon_class_1_0_00000001_for_time_clock local_29;
  duration<double,std::ratio<1l,1000000000l>> local_28 [7];
  anon_class_1_0_00000001_for_time_clock time_clock;
  duration<double,_std::ratio<1L,_1000000000L>_> local_20;
  duration<double,_std::ratio<1L,_1000000000L>_> local_18;
  duration<double,_std::ratio<1L,_1000000000L>_> time_limit;
  FloatDuration<std::chrono::_V2::steady_clock> resolution_local;
  
  time_limit.__r = resolution.__r;
  local_20 = std::chrono::operator*(&time_limit,&clock_cost_estimation_tick_limit);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_28,(duration<long,_std::ratio<1L,_1L>_> *)&clock_cost_estimation_time_limit);
  pdVar1 = std::min<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
                     (&local_20,(duration<double,_std::ratio<1L,_1000000000L>_> *)local_28);
  local_18.__r = pdVar1->__r;
  dStack_38 = estimate_clock_cost<std::chrono::_V2::steady_clock>::anon_class_16_2_7d74a361::
              anon_class_1_0_00000001_for_time_clock::operator()(&local_29,1);
  r._4_4_ = 10000;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                          ((duration<long,_std::ratio<1L,_1000L>_> *)&clock_cost_estimation_time);
  how_long.__r._4_4_ = 0;
  how_long.__r._0_4_ = r._4_4_;
  run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>(std::chrono::duration<double,std::chrono::_V2::steady_clock::period>)::_lambda(int)_1_&>
            (&local_60,
             (Detail *)
             times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,how_long,(int)&local_29,in_R8);
  local_48 = &local_60;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_80);
  __x = std::chrono::operator/(&local_18,&local_48->elapsed);
  dVar4 = ceil(__x);
  local_84 = (int)dVar4;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_80,(long)local_84);
  local_a0 = (vector<double,_std::allocator<double>_> *)
             std::back_inserter<std::vector<double,std::allocator<double>>>
                       ((vector<double,_std::allocator<double>_> *)local_80);
  local_a8 = local_48;
  __gen.r = in_stack_fffffffffffffec0;
  __gen._0_8_ = in_stack_fffffffffffffeb8;
  last._M_current =
       (double *)
       std::
       generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>(std::chrono::duration<double,std::chrono::_V2::steady_clock::period>)::_lambda()_1_>
                 ((back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)local_a0,
                  local_84,__gen);
  local_b8 = (vector<double,_std::allocator<double>_> *)last._M_current;
  iVar2 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_80);
  iVar3 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_80);
  local_c0 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        iVar2._M_current,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        iVar3._M_current);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1000000000l>> *)__return_storage_ptr__,&local_c0);
  __return_storage_ptr___00 = &__return_storage_ptr__->outliers;
  this = (vector<double,_std::allocator<double>_> *)local_80;
  iVar2 = std::vector<double,_std::allocator<double>_>::begin(this);
  iVar3 = std::vector<double,_std::allocator<double>_>::end(this);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (__return_storage_ptr___00,(Detail *)iVar2._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar3._M_current,last);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

EnvironmentEstimate<FloatDuration<Clock>> estimate_clock_cost(FloatDuration<Clock> resolution) {
                auto time_limit = (std::min)(
                    resolution * clock_cost_estimation_tick_limit,
                    FloatDuration<Clock>(clock_cost_estimation_time_limit));
                auto time_clock = [](int k) {
                    return Detail::measure<Clock>([k] {
                        for (int i = 0; i < k; ++i) {
                            volatile auto ignored = Clock::now();
                            (void)ignored;
                        }
                    }).elapsed;
                };
                time_clock(1);
                int iters = clock_cost_estimation_iterations;
                auto&& r = run_for_at_least<Clock>(std::chrono::duration_cast<ClockDuration<Clock>>(clock_cost_estimation_time), iters, time_clock);
                std::vector<double> times;
                int nsamples = static_cast<int>(std::ceil(time_limit / r.elapsed));
                times.reserve(nsamples);
                std::generate_n(std::back_inserter(times), nsamples, [time_clock, &r] {
                    return static_cast<double>((time_clock(r.iterations) / r.iterations).count());
                });
                return {
                    FloatDuration<Clock>(mean(times.begin(), times.end())),
                    classify_outliers(times.begin(), times.end()),
                };
            }